

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<std::complex<long_double>_>::AssembleCoarse
          (TPZDohrAssembly<std::complex<long_double>_> *this,int isub,
          TPZFMatrix<std::complex<long_double>_> *local,
          TPZFMatrix<std::complex<long_double>_> *global)

{
  TPZVec<int> *this_00;
  int64_t iVar1;
  int64_t iVar2;
  complex<long_double> *in_RCX;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  long in_RDI;
  int ic;
  int ncols;
  int ieq;
  int neq;
  TPZVec<int> *avec;
  complex<long_double> *in_stack_ffffffffffffff98;
  complex<long_double> *this_01;
  undefined1 local_58 [8];
  int64_t in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffc0;
  int local_38;
  int local_30;
  
  this_00 = TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 0x28),(long)in_ESI);
  iVar1 = TPZVec<int>::NElements(this_00);
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  for (local_38 = 0; local_38 < (int)iVar2; local_38 = local_38 + 1) {
    for (local_30 = 0; local_30 < (int)iVar1; local_30 = local_30 + 1) {
      (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_58,in_RDX,(long)local_30,(long)local_38);
      this_01 = in_RCX;
      TPZVec<int>::operator[](this_00,(long)local_30);
      TPZFMatrix<std::complex<long_double>_>::operator()
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::complex<long_double>::operator+=(this_01,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::AssembleCoarse(int isub, const TPZFMatrix<TVar> &local, TPZFMatrix<TVar> &global) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = local.Cols();
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            global(avec[ieq],ic) += local.GetVal(ieq,ic);
        }
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Assembling destination indices " << avec << std::endl;
		local.Print("Input vector",sout);
		global.Print("Resulting vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
}